

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall QTableViewPrivate::init(QTableViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  void *pvVar1;
  QHeaderView *pQVar2;
  QWidget *this_00;
  long in_FS_OFFSET;
  void *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)parent,
             (EditTriggers)
             ((this->super_QAbstractItemViewPrivate).editTriggers.
              super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
              super_QFlagsStorage<QAbstractItemView::EditTrigger>.i | 0x10));
  pQVar2 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(pQVar2,Vertical,parent);
  QHeaderView::setSectionsClickable(pQVar2,true);
  QHeaderView::setHighlightSections(pQVar2,true);
  QTableView::setVerticalHeader((QTableView *)parent,pQVar2);
  pQVar2 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(pQVar2,Horizontal,parent);
  QHeaderView::setSectionsClickable(pQVar2,true);
  QHeaderView::setHighlightSections(pQVar2,true);
  QTableView::setHorizontalHeader((QTableView *)parent,pQVar2);
  (this->super_QAbstractItemViewPrivate).tabKeyNavigation = true;
  this_00 = (QWidget *)operator_new(0x28);
  QTableCornerButton::QTableCornerButton((QTableCornerButton *)this_00,parent);
  this->cornerWidget = (QTableCornerButton *)this_00;
  QWidget::setFocusPolicy(this_00,NoFocus);
  QObject::connect<void(QAbstractButton::*)(bool),void(QAbstractItemView::*)()>
            ((Object *)&local_38,(offset_in_QAbstractButton_to_subr)this->cornerWidget,
             (ContextType *)QAbstractButton::clicked,(offset_in_QAbstractItemView_to_subr *)0x0,
             (ConnectionType)parent);
  pvVar1 = (this->cornerWidgetConnection).d_ptr;
  (this->cornerWidgetConnection).d_ptr = local_38;
  local_38 = pvVar1;
  QMetaObject::Connection::~Connection((Connection *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::init()
{
    Q_Q(QTableView);

    q->setEditTriggers(editTriggers|QAbstractItemView::AnyKeyPressed);

    QHeaderView *vertical = new QHeaderView(Qt::Vertical, q);
    vertical->setSectionsClickable(true);
    vertical->setHighlightSections(true);
    q->setVerticalHeader(vertical);

    QHeaderView *horizontal = new QHeaderView(Qt::Horizontal, q);
    horizontal->setSectionsClickable(true);
    horizontal->setHighlightSections(true);
    q->setHorizontalHeader(horizontal);

    tabKeyNavigation = true;

#if QT_CONFIG(abstractbutton)
    cornerWidget = new QTableCornerButton(q);
    cornerWidget->setFocusPolicy(Qt::NoFocus);
    cornerWidgetConnection = QObject::connect(
          cornerWidget, &QTableCornerButton::clicked,
          q, &QTableView::selectAll);
#endif
}